

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_custom_headers(connectdata *conn,_Bool is_connect,Curl_send_buffer *req_buffer)

{
  Curl_easy *pCVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  char cVar5;
  bool bVar6;
  char *local_a0;
  char *compare;
  byte *pbStack_78;
  CURLcode result;
  char *optr;
  char *semicolonp;
  proxy_use proxy;
  int i;
  Curl_easy *data;
  curl_slist *pcStack_50;
  int numlists;
  curl_slist *headers;
  curl_slist *h [2];
  byte *local_30;
  char *ptr;
  Curl_send_buffer *req_buffer_local;
  connectdata *pcStack_18;
  _Bool is_connect_local;
  connectdata *conn_local;
  
  pcStack_18 = conn;
  req_buffer_local._7_1_ = is_connect;
  ptr = (char *)req_buffer;
  data._4_4_ = 1;
  pCVar1 = conn->data;
  if (is_connect) {
    cVar5 = '\x02';
  }
  else {
    cVar5 = '\0';
    if ((*(uint *)&(conn->bits).field_0x4 >> 5 & 1) != 0) {
      cVar5 = (*(uint *)&(conn->bits).field_0x4 >> 0xe & 1) == 0;
    }
  }
  if (((cVar5 != '\0') && (cVar5 == '\x01')) &&
     ((*(ulong *)&(pCVar1->set).field_0x888 >> 4 & 1) != 0)) {
    h[0] = (pCVar1->set).proxyheaders;
    data._4_4_ = 2;
  }
  semicolonp._4_4_ = 0;
  do {
    if (data._4_4_ <= semicolonp._4_4_) {
      return CURLE_OK;
    }
    for (pcStack_50 = h[(long)semicolonp._4_4_ + -1]; pcStack_50 != (curl_slist *)0x0;
        pcStack_50 = pcStack_50->next) {
      optr = (char *)0x0;
      local_30 = (byte *)strchr(pcStack_50->data,0x3a);
      if ((local_30 == (byte *)0x0) &&
         (pbStack_78 = (byte *)strchr(pcStack_50->data,0x3b), local_30 = pbStack_78,
         pbVar3 = pbStack_78, pbStack_78 != (byte *)0x0)) {
        do {
          pbVar2 = pbVar3;
          local_30 = pbVar2 + 1;
          bVar6 = false;
          if (*local_30 != 0) {
            iVar4 = Curl_isspace((uint)*local_30);
            bVar6 = iVar4 != 0;
          }
          pbVar3 = local_30;
        } while (bVar6);
        if (*local_30 == 0) {
          if (*pbVar2 == 0x3b) {
            optr = (*Curl_cstrdup)(pcStack_50->data);
            if (optr == (char *)0x0) {
              Curl_add_buffer_free((Curl_send_buffer **)&ptr);
              return CURLE_OUT_OF_MEMORY;
            }
            optr[(long)pbVar2 - (long)pcStack_50->data] = ':';
            pbStack_78 = (byte *)(optr + ((long)pbVar2 - (long)pcStack_50->data));
          }
        }
        else {
          pbStack_78 = (byte *)0x0;
        }
        local_30 = pbStack_78;
      }
      if (local_30 != (byte *)0x0) {
        do {
          local_30 = local_30 + 1;
          bVar6 = false;
          if (*local_30 != 0) {
            iVar4 = Curl_isspace((uint)*local_30);
            bVar6 = iVar4 != 0;
          }
        } while (bVar6);
        if ((*local_30 != 0) || (optr != (char *)0x0)) {
          compare._4_4_ = CURLE_OK;
          if (optr == (char *)0x0) {
            local_a0 = pcStack_50->data;
          }
          else {
            local_a0 = optr;
          }
          if (((((((pcStack_18->allocptr).host == (char *)0x0) ||
                 (iVar4 = curl_strnequal("Host:",local_a0,5), iVar4 == 0)) &&
                (((pCVar1->set).httpreq != HTTPREQ_POST_FORM ||
                 (iVar4 = curl_strnequal("Content-Type:",local_a0,0xd), iVar4 == 0)))) &&
               ((((pCVar1->set).httpreq != HTTPREQ_POST_MIME ||
                 (iVar4 = curl_strnequal("Content-Type:",local_a0,0xd), iVar4 == 0)) &&
                (((*(uint *)&(pcStack_18->bits).field_0x4 >> 0xf & 1) == 0 ||
                 (iVar4 = curl_strnequal("Content-Length:",local_a0,0xf), iVar4 == 0)))))) &&
              ((((pcStack_18->allocptr).te == (char *)0x0 ||
                (iVar4 = curl_strnequal("Connection:",local_a0,0xb), iVar4 == 0)) &&
               ((pcStack_18->httpversion != 0x14 ||
                (iVar4 = curl_strnequal("Transfer-Encoding:",local_a0,0x12), iVar4 == 0)))))) &&
             (((((iVar4 = curl_strnequal("Authorization:",local_a0,0xe), iVar4 == 0 &&
                 (iVar4 = curl_strnequal("Cookie:",local_a0,7), iVar4 == 0)) ||
                ((*(ushort *)&(pCVar1->state).field_0x4e4 >> 1 & 1) == 0)) ||
               (((pCVar1->state).first_host == (char *)0x0 ||
                ((*(ulong *)&(pCVar1->set).field_0x888 >> 0x18 & 1) != 0)))) ||
              (iVar4 = Curl_strcasecompare((pCVar1->state).first_host,(pcStack_18->host).name),
              iVar4 != 0)))) {
            compare._4_4_ = Curl_add_bufferf((Curl_send_buffer **)&ptr,"%s\r\n",local_a0);
          }
          if (optr != (char *)0x0) {
            (*Curl_cfree)(optr);
          }
          if (compare._4_4_ != CURLE_OK) {
            return compare._4_4_;
          }
        }
      }
    }
    semicolonp._4_4_ = semicolonp._4_4_ + 1;
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct connectdata *conn,
                                 bool is_connect,
                                 Curl_send_buffer *req_buffer)
{
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  struct Curl_easy *data = conn->data;
  int i;

  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
                Curl_add_buffer_free(&req_buffer);
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(conn->allocptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", compare))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(conn->allocptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion == 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  (data->state.this_is_a_follow &&
                   data->state.first_host &&
                   !data->set.allow_auth_to_other_hosts &&
                   !strcasecompare(data->state.first_host, conn->host.name)))
            ;
          else {
            result = Curl_add_bufferf(&req_buffer, "%s\r\n", compare);
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}